

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uregex.cpp
# Opt level: O3

int32_t icu_63::RegexCImpl::split
                  (RegularExpression *regexp,UChar *destBuf,int32_t destCapacity,
                  int32_t *requiredCapacity,UChar **destFields,int32_t destFieldsCapacity,
                  UErrorCode *status)

{
  UChar *dest;
  RegexMatcher *this;
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  uint uVar4;
  uint uVar5;
  int32_t groupNum;
  long lVar6;
  uint uVar7;
  int32_t *piVar8;
  int iVar9;
  UErrorCode local_80;
  int32_t local_7c;
  int64_t local_78;
  int32_t *local_70;
  long local_68;
  ulong local_60;
  UChar *local_58;
  UText *local_50;
  uint local_44;
  UChar **local_40;
  ulong local_38;
  
  local_7c = destCapacity;
  local_58 = destBuf;
  RegexMatcher::reset(regexp->fMatcher);
  this = regexp->fMatcher;
  local_68 = this->fInputLength;
  if (local_68 == 0) {
    iVar2 = 0;
  }
  else {
    local_50 = this->fInputText;
    local_70 = requiredCapacity;
    iVar2 = RegexMatcher::groupCount(this);
    local_80 = U_ZERO_ERROR;
    uVar5 = destFieldsCapacity - 1;
    local_60 = (ulong)uVar5;
    local_38 = (ulong)(uint)destFieldsCapacity;
    if (destFieldsCapacity < 2) {
      uVar7 = 0;
      iVar9 = 0;
      local_78 = 0;
    }
    else {
      local_44 = destFieldsCapacity - 2;
      local_78 = 0;
      iVar9 = 0;
      uVar7 = 0;
      local_40 = destFields;
      do {
        destFields = local_40;
        UVar1 = RegexMatcher::find(regexp->fMatcher);
        dest = local_58 + iVar9;
        destFields[(int)uVar7] = dest;
        if (UVar1 == '\0') {
          iVar2 = 0;
          if (0 < local_7c - iVar9) {
            iVar2 = local_7c - iVar9;
          }
          iVar2 = utext_extract_63(local_50,local_78,local_68,dest,iVar2,status);
          iVar9 = iVar9 + iVar2 + 1;
          piVar8 = local_70;
          goto LAB_0015d3c6;
        }
        iVar3 = local_7c - iVar9;
        if (local_7c - iVar9 < 1) {
          iVar3 = 0;
        }
        iVar3 = utext_extract_63(local_50,local_78,regexp->fMatcher->fMatchStart,dest,iVar3,
                                 &local_80);
        if (local_80 == U_BUFFER_OVERFLOW_ERROR) {
          local_80 = U_ZERO_ERROR;
        }
        else {
          *status = local_80;
        }
        iVar9 = iVar9 + iVar3 + 1;
        local_78 = regexp->fMatcher->fMatchEnd;
        uVar4 = uVar7;
        if (uVar7 != (uint)local_60 && 0 < iVar2) {
          lVar6 = 1;
          uVar5 = uVar7;
          do {
            destFields[(int)uVar7 + lVar6] = local_58 + iVar9;
            local_80 = U_ZERO_ERROR;
            iVar3 = local_7c - iVar9;
            if (local_7c - iVar9 < 1) {
              iVar3 = 0;
            }
            groupNum = (int32_t)lVar6;
            iVar3 = uregex_group_63((URegularExpression *)regexp,groupNum,local_58 + iVar9,iVar3,
                                    &local_80);
            if (local_80 == U_BUFFER_OVERFLOW_ERROR) {
              local_80 = U_ZERO_ERROR;
            }
            else {
              *status = local_80;
            }
            iVar9 = iVar9 + iVar3 + 1;
            uVar4 = uVar5 + 1;
          } while ((local_44 != uVar5) && (lVar6 = lVar6 + 1, uVar5 = uVar4, groupNum < iVar2));
        }
        uVar5 = (uint)local_60;
        destFields = local_40;
        if (local_78 == local_68) {
          if (iVar9 < local_7c) {
            local_58[iVar9] = L'\0';
            uVar7 = ((int)uVar4 < (int)uVar5) + uVar4;
            local_40[(int)uVar7] = local_58 + iVar9;
          }
          else {
            uVar7 = ((int)uVar4 < (int)uVar5) + uVar4;
          }
          iVar9 = iVar9 + 1;
          piVar8 = local_70;
          goto LAB_0015d3c6;
        }
        uVar7 = uVar4 + 1;
      } while ((int)uVar7 < (int)uVar5);
    }
    piVar8 = local_70;
    if (local_78 < local_68) {
      if (uVar7 != uVar5) {
        iVar9 = (int)((ulong)((long)destFields[(int)uVar5] - (long)*destFields) >> 1);
      }
      destFields[(int)uVar5] = local_58 + iVar9;
      iVar2 = 0;
      if (0 < local_7c - iVar9) {
        iVar2 = local_7c - iVar9;
      }
      iVar2 = utext_extract_63(local_50,local_78,local_68,local_58 + iVar9,iVar2,status);
      iVar9 = iVar9 + iVar2 + 1;
      uVar7 = (uint)local_60;
    }
LAB_0015d3c6:
    iVar2 = uVar7 + 1;
    if (iVar2 < (int)local_38) {
      memset(destFields + (long)(int)uVar7 + 1,0,(ulong)(((int)local_38 - uVar7) - 2) * 8 + 8);
    }
    if (piVar8 != (int32_t *)0x0) {
      *piVar8 = iVar9;
    }
    if (local_7c < iVar9) {
      *status = U_BUFFER_OVERFLOW_ERROR;
    }
  }
  return iVar2;
}

Assistant:

int32_t RegexCImpl::split(RegularExpression     *regexp,
                          UChar                 *destBuf,
                          int32_t                destCapacity,
                          int32_t               *requiredCapacity,
                          UChar                 *destFields[],
                          int32_t                destFieldsCapacity,
                          UErrorCode            *status) {
    //
    // Reset for the input text
    //
    regexp->fMatcher->reset();
    UText *inputText = regexp->fMatcher->fInputText;
    int64_t   nextOutputStringStart = 0;
    int64_t   inputLen = regexp->fMatcher->fInputLength;
    if (inputLen == 0) {
        return 0;
    }

    //
    // Loop through the input text, searching for the delimiter pattern
    //
    int32_t   i;             // Index of the field being processed.
    int32_t   destIdx = 0;   // Next available position in destBuf;
    int32_t   numCaptureGroups = regexp->fMatcher->groupCount();
    UErrorCode  tStatus = U_ZERO_ERROR;   // Want to ignore any buffer overflow errors so that the strings are still counted
    for (i=0; ; i++) {
        if (i>=destFieldsCapacity-1) {
            // There are one or zero output strings left.
            // Fill the last output string with whatever is left from the input, then exit the loop.
            //  ( i will be == destFieldsCapacity if we filled the output array while processing
            //    capture groups of the delimiter expression, in which case we will discard the
            //    last capture group saved in favor of the unprocessed remainder of the
            //    input string.)
            if (inputLen > nextOutputStringStart) {
                if (i != destFieldsCapacity-1) {
                    // No fields are left.  Recycle the last one for holding the trailing part of
                    //   the input string.
                    i = destFieldsCapacity-1;
                    destIdx = (int32_t)(destFields[i] - destFields[0]);
                }

                destFields[i] = &destBuf[destIdx];
                destIdx += 1 + utext_extract(inputText, nextOutputStringStart, inputLen,
                                             &destBuf[destIdx], REMAINING_CAPACITY(destIdx, destCapacity), status);
            }
            break;
        }

        if (regexp->fMatcher->find()) {
            // We found another delimiter.  Move everything from where we started looking
            //  up until the start of the delimiter into the next output string.
            destFields[i] = &destBuf[destIdx];

            destIdx += 1 + utext_extract(inputText, nextOutputStringStart, regexp->fMatcher->fMatchStart,
                                         &destBuf[destIdx], REMAINING_CAPACITY(destIdx, destCapacity), &tStatus);
            if (tStatus == U_BUFFER_OVERFLOW_ERROR) {
                tStatus = U_ZERO_ERROR;
            } else {
                *status = tStatus;
            }
            nextOutputStringStart = regexp->fMatcher->fMatchEnd;

            // If the delimiter pattern has capturing parentheses, the captured
            //  text goes out into the next n destination strings.
            int32_t groupNum;
            for (groupNum=1; groupNum<=numCaptureGroups; groupNum++) {
                // If we've run out of output string slots, bail out.
                if (i==destFieldsCapacity-1) {
                    break;
                }
                i++;

                // Set up to extract the capture group contents into the dest buffer.
                destFields[i] = &destBuf[destIdx];
                tStatus = U_ZERO_ERROR;
                int32_t t = uregex_group((URegularExpression*)regexp,
                                         groupNum,
                                         destFields[i],
                                         REMAINING_CAPACITY(destIdx, destCapacity),
                                         &tStatus);
                destIdx += t + 1;    // Record the space used in the output string buffer.
                                     //  +1 for the NUL that terminates the string.
                if (tStatus == U_BUFFER_OVERFLOW_ERROR) {
                    tStatus = U_ZERO_ERROR;
                } else {
                    *status = tStatus;
                }
            }

            if (nextOutputStringStart == inputLen) {
                // The delimiter was at the end of the string.
                // Output an empty string, and then we are done.
                if (destIdx < destCapacity) {
                    destBuf[destIdx] = 0;
                }
                if (i < destFieldsCapacity-1) {
                   ++i;
                }
                if (destIdx < destCapacity) {
                    destFields[i] = destBuf + destIdx;
                }
                ++destIdx;
                break;
            }

        }
        else
        {
            // We ran off the end of the input while looking for the next delimiter.
            // All the remaining text goes into the current output string.
            destFields[i] = &destBuf[destIdx];
            destIdx += 1 + utext_extract(inputText, nextOutputStringStart, inputLen,
                                         &destBuf[destIdx], REMAINING_CAPACITY(destIdx, destCapacity), status);
            break;
        }
    }

    // Zero out any unused portion of the destFields array
    int j;
    for (j=i+1; j<destFieldsCapacity; j++) {
        destFields[j] = NULL;
    }

    if (requiredCapacity != NULL) {
        *requiredCapacity = destIdx;
    }
    if (destIdx > destCapacity) {
        *status = U_BUFFER_OVERFLOW_ERROR;
    }
    return i+1;
}